

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

int GetCharConstAsString<unsigned_char>(char **p,uchar *e,int *ei,int max_ei,int add)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char local_49;
  int local_48;
  aint local_40;
  byte local_39;
  aint val;
  bool quotes;
  char *elementP;
  int add_local;
  int max_ei_local;
  int *ei_local;
  uchar *e_local;
  char **p_local;
  
  if ((**p == '\"') || (**p == '\'')) {
    _val = *p;
    pcVar2 = *p;
    *p = pcVar2 + 1;
    local_39 = *pcVar2 == '\"';
    elementP._0_4_ = add;
    elementP._4_4_ = max_ei;
    _add_local = ei;
    ei_local = (int *)e;
    e_local = (uchar *)p;
    while( true ) {
      bVar3 = false;
      if (*_add_local < elementP._4_4_) {
        if ((local_39 & 1) == 0) {
          local_48 = GetCharConstInApostrophes((char **)e_local,&local_40);
        }
        else {
          local_48 = GetCharConstInDoubleQuotes((char **)e_local,&local_40);
        }
        bVar3 = local_48 != 0;
      }
      if (!bVar3) break;
      iVar1 = *_add_local;
      *_add_local = iVar1 + 1;
      *(char *)((long)ei_local + (long)iVar1) = (char)local_40 + (char)(int)elementP;
    }
    local_49 = '\"';
    if ((local_39 & 1) == 0) {
      local_49 = '\'';
    }
    if (local_49 == **(char **)e_local) {
      *(long *)e_local = *(long *)e_local + 1;
      if (**(char **)e_local == 'Z') {
        if (elementP._4_4_ <= *_add_local) {
          return -2;
        }
        *(long *)e_local = *(long *)e_local + 1;
        iVar1 = *_add_local;
        *_add_local = iVar1 + 1;
        *(undefined1 *)((long)ei_local + (long)iVar1) = 0;
      }
      else if (**(char **)e_local == 'C') {
        *(long *)e_local = *(long *)e_local + 1;
        if (*_add_local == 0) {
          return -1;
        }
        *(byte *)((long)ei_local + (long)(*_add_local + -1)) =
             *(byte *)((long)ei_local + (long)(*_add_local + -1)) | 0x80;
      }
      p_local._4_4_ = (local_39 & 1) + 1;
    }
    else if (**(char **)e_local == '\0') {
      Error("Syntax error",_val,SUPPRESS);
      p_local._4_4_ = -1;
    }
    else {
      p_local._4_4_ = -2;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int GetCharConstAsString(char* & p, strT e[], int & ei, int max_ei, int add) {
	if ('"' != *p && '\'' != *p) return 0;
	const char* const elementP = p;
	const bool quotes = ('"' == *p++);
	aint val;
	while (ei < max_ei && (quotes ? GetCharConstInDoubleQuotes(p, val) : GetCharConstInApostrophes(p, val))) {
		e[ei++] = (val + add) & 255;
	}
	if ((quotes ? '"' : '\'') != *p) {	// too many/invalid arguments or zero-terminator can lead to this
		if (*p) return -2;				// too many arguments
		Error("Syntax error", elementP, SUPPRESS);	// zero-terminator
		return -1;
	}
	++p;
	if ('Z' == *p) {
		if (max_ei <= ei) return -2;	// no space for zero byte (keep p pointing at Z to report error)
		++p;
		e[ei++] = 0;
	} else if ('C' == *p) {
		++p;
		if (0 == ei) return -1;			// empty string can't have last char patched
		e[ei - 1] |= 0x80;
	}
	return 1 + quotes;
}